

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizardPrivate::_q_emitCustomButtonClicked(QWizardPrivate *this)

{
  long lVar1;
  QWizardPrivate *in_RDI;
  int i;
  QObject *button;
  QWizard *q;
  int local_1c;
  
  q_func(in_RDI);
  lVar1 = QObject::sender();
  local_1c = 6;
  while( true ) {
    if (8 < local_1c) {
      return;
    }
    if (*(long *)((long)&in_RDI->field_20 + (long)local_1c * 8) == lVar1) break;
    local_1c = local_1c + 1;
  }
  QWizard::customButtonClicked((QWizard *)0x7b9e44,(int)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

void QWizardPrivate::_q_emitCustomButtonClicked()
{
    Q_Q(QWizard);
    QObject *button = q->sender();
    for (int i = QWizard::NStandardButtons; i < QWizard::NButtons; ++i) {
        if (btns[i] == button) {
            emit q->customButtonClicked(QWizard::WizardButton(i));
            break;
        }
    }
}